

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_SetStringLarge_Test::TestBody
          (MicroStringPrevTest_SetStringLarge_Test *this)

{
  bool bVar1;
  PreviousState PVar2;
  Arena *args;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  AssertHelper local_148;
  Message local_140;
  size_t local_138;
  unsigned_long local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  Message local_110;
  unsigned_long local_108;
  unsigned_long local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  Message local_e0;
  string_view local_d8;
  const_pointer local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  string_view local_a0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  size_t used;
  char *copy_data;
  string copy;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string input;
  MicroStringPrevTest_SetStringLarge_Test *this_local;
  
  input.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,0x80,'a',&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&copy_data,(string *)local_38);
  used = std::__cxx11::string::data();
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  args = MicroStringPrevTest::arena(&this->super_MicroStringPrevTest);
  MicroString::Set<google::protobuf::Arena*>
            (&(this->super_MicroStringPrevTest).str_,(string *)&copy_data,args);
  local_a0 = MicroString::Get(&(this->super_MicroStringPrevTest).str_);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_90,"str_.Get()","input",&local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x249,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_d8 = MicroString::Get(&(this->super_MicroStringPrevTest).str_);
  local_c8 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_d8);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((EqHelper *)local_c0,"copy_data","str_.Get().data()",(char **)&used,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x24c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  PVar2 = MicroStringPrevTest::prev_state(&this->super_MicroStringPrevTest);
  if (PVar2 != kString) {
    bVar1 = MicroStringPrevTest::has_arena(&this->super_MicroStringPrevTest);
    if (bVar1) {
      local_100 = 0x30;
      sVar4 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
      local_108 = sVar4 - (long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_f8,"ArenaAlignDefault::Ceil(kLargeRepSize + sizeof(std::string))"
                 ,"arena_space_used() - used",&local_100,&local_108);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
      if (!bVar1) {
        testing::Message::Message(&local_110);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x253,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_110);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_110);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    }
  }
  lVar5 = std::__cxx11::string::capacity();
  local_130 = lVar5 + 0x31;
  local_138 = MicroString::SpaceUsedExcludingSelfLong(&(this->super_MicroStringPrevTest).str_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_128,"kLargeRepSize + sizeof(std::string) + input.capacity() + 1",
             "str_.SpaceUsedExcludingSelfLong()",&local_130,&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x256,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::__cxx11::string::~string((string *)&copy_data);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SetStringLarge) {
  std::string input(128, 'a');
  std::string copy = input;
  const char* copy_data = copy.data();
  const size_t used = arena_space_used();
  str_.Set(std::move(copy), arena());
  EXPECT_EQ(str_.Get(), input);

  // Verify that the string was moved.
  EXPECT_EQ(copy_data, str_.Get().data());

  // In 32-bit mode, we will use memory that is not rounded to the arena
  // alignment because sizeof(StringRep) might not be a multiple of 8. Avoid
  // using `ExpectMemoryUsed` because it expects it.
  if (prev_state() != kString && has_arena()) {
    EXPECT_EQ(ArenaAlignDefault::Ceil(kLargeRepSize + sizeof(std::string)),
              arena_space_used() - used);
  }
  EXPECT_EQ(kLargeRepSize + sizeof(std::string) + input.capacity() + /* \0 */ 1,
            str_.SpaceUsedExcludingSelfLong());
}